

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

int caption_frame_from_text(caption_frame_t *frame,utf8_char_t *data)

{
  caption_frame_buffer_t *__src;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  utf8_size_t uVar4;
  size_t c;
  utf8_size_t uVar5;
  size_t r;
  ulong uVar6;
  
  sVar2 = strlen(data);
  caption_frame_init(frame);
  __src = &frame->back;
  frame->write = __src;
  uVar6 = 0;
  do {
    if (((*data == '\0') || (sVar2 == 0)) || (0xe < uVar6)) {
      memcpy(&frame->front,__src,0xf00);
      memset(__src,0,0xf00);
      return 0;
    }
    for (; sVar2 != 0; sVar2 = sVar2 - sVar3) {
      iVar1 = utf8_char_whitespace(data);
      if (iVar1 == 0) break;
      sVar3 = utf8_char_length(data);
      data = data + sVar3;
    }
    uVar4 = utf8_wrap_length(data,0x20);
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      sVar3 = utf8_char_length(data);
      caption_frame_write_char(frame,(int)uVar6,(int)uVar5,eia608_style_white,0,data);
      data = data + sVar3;
      sVar2 = sVar2 - sVar3;
    }
    uVar6 = (uVar6 + 1) - (ulong)(uVar4 == 0);
  } while( true );
}

Assistant:

int caption_frame_from_text(caption_frame_t* frame, const utf8_char_t* data)
{
    ssize_t size = (ssize_t)strlen(data);
    caption_frame_init(frame);
    frame->write = &frame->back;

    for (size_t r = 0; (*data) && size && r < SCREEN_ROWS;) {
        // skip whitespace at start of line
        while (size && utf8_char_whitespace(data)) {
            size_t s = utf8_char_length(data);
            data += s, size -= s;
        }

        // get charcter count for wrap (or orest of line)
        utf8_size_t char_count = utf8_wrap_length(data, SCREEN_COLS);
        // write to caption frame
        for (size_t c = 0; c < char_count; ++c) {
            size_t char_length = utf8_char_length(data);
            caption_frame_write_char(frame, r, c, eia608_style_white, 0, data);
            data += char_length, size -= char_length;
        }

        r += char_count ? 1 : 0; // Update row num only if not blank
    }

    caption_frame_end(frame);
    return 0;
}